

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::RescanRegExpTokenizer
          (Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  tokens tVar1;
  EncodedCharPtr puVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  char *message;
  char *error;
  uint lineNumber;
  anon_class_24_3_e8f67b35 local_60;
  anon_class_16_2_436b1a79 local_48;
  ThreadContext *local_38;
  ThreadContext *threadContext;
  TempArenaAllocatorObject *alloc;
  tokens tk;
  
  tVar1 = this->m_ptoken->tk;
  if (tVar1 == tkAsgDiv) {
    if (this->m_currentCharacter == this->m_pchMinTok + 2) goto LAB_00f151f5;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    error = "(m_currentCharacter == m_pchMinTok + 2)";
    message = "m_currentCharacter == m_pchMinTok + 2";
    lineNumber = 0x333;
  }
  else if (tVar1 == tkDiv) {
    if (this->m_currentCharacter == this->m_pchMinTok + 1) goto LAB_00f151f5;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    error = "(m_currentCharacter == m_pchMinTok + 1)";
    message = "m_currentCharacter == m_pchMinTok + 1";
    lineNumber = 0x330;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    error = "(0)";
    message = "Who is calling RescanRegExpNoParseTree?";
    lineNumber = 0x336;
  }
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                     ,lineNumber,error,message);
  if (!bVar4) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar5 = 0;
LAB_00f151f5:
  puVar2 = this->m_pchMinTok;
  this->m_currentCharacter = puVar2;
  if (*puVar2 == '/') {
    this->m_currentCharacter = puVar2 + 1;
    alloc._4_4_ = tkNone;
    local_38 = ThreadContext::GetContextForCurrentThread();
    ThreadContext::EnsureRecycler(local_38);
    threadContext = (ThreadContext *)ThreadContext::GetTemporaryAllocator(local_38,L"RescanRegExp");
    local_60.alloc = (TempArenaAllocatorObject **)&threadContext;
    local_60.tk = (tokens *)((long)&alloc + 4);
    local_60.this = this;
    local_48.threadContext = &local_38;
    local_48.alloc = local_60.alloc;
    TryFinally<Scanner<UTF8EncodingPolicyBase<false>>::RescanRegExpTokenizer()::_lambda()_1_,Scanner<UTF8EncodingPolicyBase<false>>::RescanRegExpTokenizer()::_lambda(bool)_1_>
              (&local_60,&local_48);
    return alloc._4_4_;
  }
  Error(this,-0x7ff5fc0c);
}

Assistant:

tokens Scanner<EncodingPolicy>::RescanRegExpTokenizer()
{
#if DEBUG
    switch (m_ptoken->tk)
    {
    case tkDiv:
        Assert(m_currentCharacter == m_pchMinTok + 1);
        break;
    case tkAsgDiv:
        Assert(m_currentCharacter == m_pchMinTok + 2);
        break;
    default:
        AssertMsg(FALSE, "Who is calling RescanRegExpNoParseTree?");
        break;
    }
#endif //DEBUG

    m_currentCharacter = m_pchMinTok;
    if (*m_currentCharacter != '/')
        Error(ERRnoSlash);
    m_currentCharacter++;

    tokens tk = tkNone;

    ThreadContext *threadContext = ThreadContext::GetContextForCurrentThread();
    threadContext->EnsureRecycler();
    Js::TempArenaAllocatorObject *alloc = threadContext->GetTemporaryAllocator(_u("RescanRegExp"));
    TryFinally(
        [&]() /* try block */
        {
            tk = this->ScanRegExpConstantNoAST(alloc->GetAllocator());
        },
        [&](bool /* hasException */) /* finally block */
        {
            threadContext->ReleaseTemporaryAllocator(alloc);
        });

    return tk;
}